

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  void *pvVar1;
  ostream *poVar2;
  long lVar3;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  initializer_list<float> __l_03;
  initializer_list<float> __l_04;
  initializer_list<float> __l_05;
  initializer_list<float> __l_06;
  initializer_list<nanoNet::DataPoint> __l_07;
  initializer_list<float> __l_08;
  initializer_list<float> __l_09;
  initializer_list<float> __l_10;
  initializer_list<float> __l_11;
  NeuralNetwork network;
  Trainer trainer;
  DataSet data;
  vector<float,_std::allocator<float>_> local_188;
  allocator_type local_169;
  allocator_type local_168;
  allocator_type local_167;
  allocator_type local_166;
  allocator_type local_165;
  allocator_type local_164;
  allocator_type local_163;
  allocator_type local_162;
  allocator_type local_161;
  undefined8 local_160;
  float local_158 [2];
  undefined8 local_150;
  NeuralNetwork local_148;
  Trainer local_130;
  undefined1 local_118 [24];
  vector<float,_std::allocator<float>_> local_100;
  vector<float,_std::allocator<float>_> local_e8;
  vector<float,_std::allocator<float>_> local_d0;
  vector<float,_std::allocator<float>_> local_b8;
  vector<float,_std::allocator<float>_> local_a0;
  vector<float,_std::allocator<float>_> local_88;
  vector<float,_std::allocator<float>_> local_70;
  vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_> local_58;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_> local_30;
  
  nanoNet::NeuralNetwork::NeuralNetwork(&local_148);
  local_58.super__Vector_base<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  nanoNet::ActivationFunction::ActivationFunction
            ((ActivationFunction *)&local_130,(Which *)&local_58);
  nanoNet::NeuralNetworkLayer::NeuralNetworkLayer
            ((NeuralNetworkLayer *)local_118,2,8,(ActivationFunction *)&local_130);
  nanoNet::NeuralNetwork::addLayer(&local_148,(NeuralNetworkLayer *)local_118);
  nanoNet::NeuralNetworkLayer::~NeuralNetworkLayer((NeuralNetworkLayer *)local_118);
  local_58.super__Vector_base<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 3;
  nanoNet::ActivationFunction::ActivationFunction
            ((ActivationFunction *)&local_130,(Which *)&local_58);
  nanoNet::NeuralNetworkLayer::NeuralNetworkLayer
            ((NeuralNetworkLayer *)local_118,8,1,(ActivationFunction *)&local_130);
  nanoNet::NeuralNetwork::addLayer(&local_148,(NeuralNetworkLayer *)local_118);
  nanoNet::NeuralNetworkLayer::~NeuralNetworkLayer((NeuralNetworkLayer *)local_118);
  local_130.epoch_count = 10000;
  local_130.batch_size = 2;
  local_130.learning_rate = 0.002;
  local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_188;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_118,__l,&local_161);
  local_34 = 0.0;
  __l_00._M_len = 1;
  __l_00._M_array = &local_34;
  std::vector<float,_std::allocator<float>_>::vector(&local_100,__l_00,&local_162);
  local_150 = 0x3f80000000000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_150;
  std::vector<float,_std::allocator<float>_>::vector(&local_e8,__l_01,&local_163);
  local_38 = 1.0;
  __l_02._M_len = 1;
  __l_02._M_array = &local_38;
  std::vector<float,_std::allocator<float>_>::vector(&local_d0,__l_02,&local_164);
  local_158[0] = 1.0;
  local_158[1] = 0.0;
  __l_03._M_len = 2;
  __l_03._M_array = local_158;
  std::vector<float,_std::allocator<float>_>::vector(&local_b8,__l_03,&local_165);
  local_3c = 1.0;
  __l_04._M_len = 1;
  __l_04._M_array = &local_3c;
  std::vector<float,_std::allocator<float>_>::vector(&local_a0,__l_04,&local_166);
  local_160 = 0x3f8000003f800000;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_160;
  std::vector<float,_std::allocator<float>_>::vector(&local_88,__l_05,&local_167);
  local_40 = 0.0;
  __l_06._M_len = 1;
  __l_06._M_array = &local_40;
  std::vector<float,_std::allocator<float>_>::vector(&local_70,__l_06,&local_168);
  __l_07._M_len = 4;
  __l_07._M_array = (iterator)local_118;
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::vector
            (&local_58,__l_07,&local_169);
  lVar3 = 0xc0;
  do {
    pvVar1 = *(void **)((long)&local_130.epoch_count + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_118 + lVar3 + -8) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)&local_148.m_layers.
                               super__Vector_base<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_148.m_layers.
                                              super__Vector_base<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      lVar3) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != 0);
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::vector(&local_30,&local_58);
  nanoNet::Trainer::train(&local_130,&local_148,&local_30);
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::~vector(&local_30);
  local_118[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_118,1);
  local_150 = 0;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_150;
  std::vector<float,_std::allocator<float>_>::vector(&local_188,__l_08,(allocator_type *)&local_160)
  ;
  nanoNet::NeuralNetwork::predict((vector_type *)local_118,&local_148,&local_188);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((float)(int)(*(float *)CONCAT71(local_118._1_7_,local_118[0]) +
                                            *(float *)CONCAT71(local_118._1_7_,local_118[0]) + 0.5)
                              * 0.5));
  local_158[0]._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_158,1);
  pvVar1 = (void *)CONCAT71(local_118._1_7_,local_118[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_118._16_8_ - (long)pvVar1);
  }
  if (local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_150 = 0x3f80000000000000;
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)&local_150;
  std::vector<float,_std::allocator<float>_>::vector(&local_188,__l_09,(allocator_type *)&local_160)
  ;
  nanoNet::NeuralNetwork::predict((vector_type *)local_118,&local_148,&local_188);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((float)(int)(*(float *)CONCAT71(local_118._1_7_,local_118[0]) +
                                            *(float *)CONCAT71(local_118._1_7_,local_118[0]) + 0.5)
                              * 0.5));
  local_158[0]._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_158,1);
  pvVar1 = (void *)CONCAT71(local_118._1_7_,local_118[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_118._16_8_ - (long)pvVar1);
  }
  if (local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_150 = 0x3f800000;
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)&local_150;
  std::vector<float,_std::allocator<float>_>::vector(&local_188,__l_10,(allocator_type *)&local_160)
  ;
  nanoNet::NeuralNetwork::predict((vector_type *)local_118,&local_148,&local_188);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((float)(int)(*(float *)CONCAT71(local_118._1_7_,local_118[0]) +
                                            *(float *)CONCAT71(local_118._1_7_,local_118[0]) + 0.5)
                              * 0.5));
  local_158[0]._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_158,1);
  pvVar1 = (void *)CONCAT71(local_118._1_7_,local_118[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_118._16_8_ - (long)pvVar1);
  }
  if (local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_150 = 0x3f8000003f800000;
  __l_11._M_len = 2;
  __l_11._M_array = (iterator)&local_150;
  std::vector<float,_std::allocator<float>_>::vector(&local_188,__l_11,(allocator_type *)&local_160)
  ;
  nanoNet::NeuralNetwork::predict((vector_type *)local_118,&local_148,&local_188);
  poVar2 = std::ostream::_M_insert<double>
                     ((double)((float)(int)(*(float *)CONCAT71(local_118._1_7_,local_118[0]) +
                                            *(float *)CONCAT71(local_118._1_7_,local_118[0]) + 0.5)
                              * 0.5));
  local_158[0]._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_158,1);
  pvVar1 = (void *)CONCAT71(local_118._1_7_,local_118[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,local_118._16_8_ - (long)pvVar1);
  }
  if (local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_118[0] = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_118,1);
  std::vector<nanoNet::DataPoint,_std::allocator<nanoNet::DataPoint>_>::~vector(&local_58);
  std::vector<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>::~vector
            (&local_148.m_layers);
  return 0;
}

Assistant:

int main() {

    NeuralNetwork network;

    network.addLayer({2, 8, {ActivationFunction::Which::Relu}});
    network.addLayer({8, 1, {ActivationFunction::Which::Linear}});

    // 10000 epochs, batch size = 2, training rate = 0.002
    Trainer trainer { 10000 , 2 , 0.002 };

    Trainer::DataSet data {{
        {{{0.0, 0.0}},{{0.0}}},
        {{{0.0, 1.0}},{{1.0}}},
        {{{1.0, 0.0}},{{1.0}}},
        {{{1.0, 1.0}},{{0.0}}}
    }};

    // stochastic gradient descent
    trainer.train ( network, data );

    auto rnd_base = []( float k ){ return [=]( float x ){ return ( int(x*k+0.5) ) / k; }; };
    auto rnd = rnd_base(2);

    std::cout << '\n';
    std::cout << rnd(network.predict({{0.0, 0.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{0.0, 1.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{1.0, 0.0}})[0]) << '\n';
    std::cout << rnd(network.predict({{1.0, 1.0}})[0]) << '\n';
    std::cout << '\n';

    return 0;
}